

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TransparentMemberSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol&>
          (BumpAllocator *this,EnumValueSymbol *args)

{
  TransparentMemberSymbol *this_00;
  
  this_00 = (TransparentMemberSymbol *)allocate(this,0x48,8);
  ast::TransparentMemberSymbol::TransparentMemberSymbol(this_00,(Symbol *)args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }